

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoffSolver_T.h
# Opt level: O0

shared_ptr<JointPolicyDiscretePure> __thiscall
BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>::GetNewJpol
          (BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> *this)

{
  bool bVar1;
  Index IVar2;
  type pJVar3;
  type this_00;
  shared_count extraout_RDX;
  shared_ptr<JointPolicyDiscretePure> *in_RDI;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> sVar4;
  shared_ptr<JointPolicyDiscretePure> sVar5;
  shared_ptr<const_JointPolicyDiscretePure> pastJpol;
  shared_ptr<JointPolicyPureVectorForClusteredBG> JPPVfCBG;
  shared_ptr<JointPolicyPureVector> jpol;
  JPPVfCBG_constPtr *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  shared_ptr<const_JointPolicyDiscretePure> *in_stack_ffffffffffffff08;
  shared_ptr<JointPolicyPureVector> *in_stack_ffffffffffffff10;
  I_PtPDpure_constPtr *in_stack_ffffffffffffff28;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *this_01;
  shared_ptr<const_BayesianGameWithClusterInfo> local_a0 [2];
  shared_ptr<const_BayesianGameWithClusterInfo> local_80 [2];
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_60;
  undefined1 local_4e;
  undefined1 local_40 [16];
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> local_30;
  undefined1 local_20 [32];
  
  operator_new(0x98);
  local_4e = 1;
  sVar4 = BayesianGameIdenticalPayoffSolver::GetBGIPI
                    ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffffee8);
  this_01 = &local_30;
  boost::shared_ptr<Interface_ProblemToPolicyDiscretePure_const>::
  shared_ptr<BayesianGameIdenticalPayoffInterface_const>(this_01,local_40,sVar4.pn.pi_.pi_);
  JointPolicyPureVector::JointPolicyPureVector
            ((JointPolicyPureVector *)this_01,in_stack_ffffffffffffff28);
  local_4e = 0;
  boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>
            (in_stack_ffffffffffffff10,(JointPolicyPureVector *)in_stack_ffffffffffffff08);
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x12ace0);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x12aced);
  boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyPureVector>
            ((shared_ptr<JointPolicyPureVector> *)in_stack_ffffffffffffff08);
  bVar1 = boost::shared_ptr::operator_cast_to_bool((shared_ptr *)&local_60);
  if (bVar1) {
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(&local_60);
    JointPolicyPureVectorForClusteredBG::GetBG
              ((JointPolicyPureVectorForClusteredBG *)in_stack_fffffffffffffee8);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_80);
    BayesianGameWithClusterInfo::GetPastJointPolicyPVFCBG
              ((BayesianGameWithClusterInfo *)in_stack_fffffffffffffee8);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x12ad75);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(&local_60);
    boost::
    dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG_const,JointPolicyDiscretePure_const>
              (in_stack_ffffffffffffff08);
    JointPolicyPureVectorForClusteredBG::SetPrevJPPVfCBG
              ((JointPolicyPureVectorForClusteredBG *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::~shared_ptr
              ((shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)0x12adc1);
    pJVar3 = boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(&local_60);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(&local_60);
    JointPolicyPureVectorForClusteredBG::GetBG
              ((JointPolicyPureVectorForClusteredBG *)in_stack_fffffffffffffee8);
    this_00 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(local_a0);
    IVar2 = BayesianGameForDecPOMDPStageInterface::GetStage
                      ((BayesianGameForDecPOMDPStageInterface *)this_00);
    (**(code **)(*(long *)pJVar3 + 0x10))(pJVar3,IVar2);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x12ae3d);
    boost::shared_ptr<const_JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<const_JointPolicyDiscretePure> *)0x12ae4a);
  }
  boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr<JointPolicyPureVector>(in_RDI,local_20);
  boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
            ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x12af77);
  boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
            ((shared_ptr<JointPolicyPureVector> *)0x12af84);
  sVar5.pn.pi_ = extraout_RDX.pi_;
  sVar5.px = (element_type *)in_RDI;
  return sVar5;
}

Assistant:

virtual boost::shared_ptr<JointPolicyDiscretePure> GetNewJpol() const
    //boost::shared_ptr<JP> GetNewJpol() const
    {
        boost::shared_ptr<JP> jpol = boost::shared_ptr<JP>(new JP(this->GetBGIPI()));
        // check whether it is a
        // JointPolicyPureVectorForClusteredBG, because then we
        // need to store more things
        boost::shared_ptr<JointPolicyPureVectorForClusteredBG> JPPVfCBG=
            boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(jpol);
        if(JPPVfCBG)
        {
            boost::shared_ptr<const JointPolicyDiscretePure> pastJpol =
                JPPVfCBG->GetBG()->GetPastJointPolicyPVFCBG();
            JPPVfCBG->SetPrevJPPVfCBG(
                boost::dynamic_pointer_cast<const JointPolicyPureVectorForClusteredBG>(pastJpol));
            JPPVfCBG->SetDepth(JPPVfCBG->GetBG()->GetStage());
        }
        return(jpol);
    }